

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O2

void __thiscall
OpenMD::Ellipsoid::Ellipsoid
          (Ellipsoid *this,Vector3d *origin,RealType rAxial,RealType rEquatorial,Mat3x3d *rotMat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  (this->super_Shape).name_._M_dataplus._M_p = (pointer)&(this->super_Shape).name_.field_2;
  (this->super_Shape).name_._M_string_length = 0;
  (this->super_Shape).name_.field_2._M_local_buf[0] = '\0';
  (this->super_Shape)._vptr_Shape = (_func_int **)&PTR__Ellipsoid_00288838;
  Vector<double,_3U>::Vector
            (&(this->origin_).super_Vector<double,_3U>,&origin->super_Vector<double,_3U>);
  this->rAxial_ = rAxial;
  this->rEquatorial_ = rEquatorial;
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->rotMat_,(RectMatrix<double,_3U,_3U> *)rotMat);
  dVar1 = this->rAxial_;
  dVar2 = this->rEquatorial_;
  dVar3 = dVar2;
  if (dVar1 <= dVar2) {
    dVar3 = dVar1;
    dVar1 = dVar2;
  }
  this->rMajor_ = dVar1;
  this->rMinor_ = dVar3;
  return;
}

Assistant:

Ellipsoid::Ellipsoid(Vector3d origin, RealType rAxial, RealType rEquatorial,
                       Mat3x3d rotMat) :
      origin_(origin),
      rAxial_(rAxial), rEquatorial_(rEquatorial), rotMat_(rotMat) {
    if (rAxial_ > rEquatorial_) {
      rMajor_ = rAxial_;
      rMinor_ = rEquatorial_;
    } else {
      rMajor_ = rEquatorial_;
      rMinor_ = rAxial_;
    }
  }